

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

bool __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Clean(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this)

{
  if ((this->disableCleanup == false) &&
     (this->recycler->weakReferenceCleanupId != this->lastWeakReferenceCleanupId)) {
    WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true>::
    Map<JsUtil::WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true>::Clean()::_lambda(Js::Type*,bool,Memory::RecyclerWeakReference<Js::Type>const*)_1_>
              ((WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true> *
               )this);
    this->lastWeakReferenceCleanupId = this->recycler->weakReferenceCleanupId;
  }
  return 0 < this->freeCount;
}

Assistant:

bool Clean()
        {
            if (!disableCleanup && recycler->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                Map([](TKey * key, TValue value, const RecyclerWeakReference<TKey>* weakRef) {});
                this->lastWeakReferenceCleanupId = recycler->GetWeakReferenceCleanupId();
            }

            return freeCount > 0;
        }